

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

int64_t __thiscall indk::NeuralNet::doFindEntry(NeuralNet *this,string *ename)

{
  pointer ppVar1;
  __type _Var2;
  int64_t iVar3;
  pointer ppVar4;
  long lVar5;
  pointer __lhs;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  __lhs = (this->Entries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_50,(string *)ename);
  std::__cxx11::string::string(local_90,local_50);
  std::__cxx11::string::string((string *)&local_b0,local_90);
  std::__cxx11::string::string(local_70,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,local_70);
  lVar6 = (long)ppVar1 - (long)__lhs;
  for (lVar5 = lVar6 / 0x38 >> 2; ppVar4 = __lhs, 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var2 = std::operator==(&__lhs->first,&local_b0);
    if (_Var2) goto LAB_0010f9e6;
    _Var2 = std::operator==(&__lhs[1].first,&local_b0);
    ppVar4 = __lhs + 1;
    if (_Var2) goto LAB_0010f9e6;
    _Var2 = std::operator==(&__lhs[2].first,&local_b0);
    ppVar4 = __lhs + 2;
    if (_Var2) goto LAB_0010f9e6;
    _Var2 = std::operator==(&__lhs[3].first,&local_b0);
    ppVar4 = __lhs + 3;
    if (_Var2) goto LAB_0010f9e6;
    __lhs = __lhs + 4;
    lVar6 = lVar6 + -0xe0;
  }
  lVar6 = lVar6 / 0x38;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      ppVar4 = ppVar1;
      if ((lVar6 != 3) || (_Var2 = std::operator==(&__lhs->first,&local_b0), ppVar4 = __lhs, _Var2))
      goto LAB_0010f9e6;
      ppVar4 = __lhs + 1;
    }
    _Var2 = std::operator==(&ppVar4->first,&local_b0);
    if (_Var2) goto LAB_0010f9e6;
    __lhs = ppVar4 + 1;
  }
  _Var2 = std::operator==(&__lhs->first,&local_b0);
  ppVar4 = ppVar1;
  if (_Var2) {
    ppVar4 = __lhs;
  }
LAB_0010f9e6:
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_50);
  if (ppVar4 == (this->Entries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = -1;
  }
  else {
    iVar3 = ((long)ppVar4 -
            (long)(this->Entries).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x38;
  }
  return iVar3;
}

Assistant:

int64_t indk::NeuralNet::doFindEntry(const std::string& ename) {
    auto ne = std::find_if(Entries.begin(), Entries.end(), [ename](const std::pair<std::string, std::vector<std::string>>& e){
        return e.first == ename;
    });
    if (ne == Entries.end()) return -1;
    return std::distance(Entries.begin(), ne);
}